

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_manual_hostkey.c
# Opt level: O2

_Bool validate_manual_hostkey(char *key)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  _Bool _Var10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  undefined8 in_RAX;
  size_t sVar14;
  __int32_t **pp_Var15;
  char *pcVar16;
  char *pcVar17;
  char *__s;
  long lVar18;
  char *__s_00;
  char *__s_01;
  undefined8 uStack_38;
  uchar decoded [6];
  
  __s_01 = key;
  uStack_38 = in_RAX;
LAB_00165e59:
  sVar14 = strspn(__s_01," \t");
  cVar2 = __s_01[sVar14];
  if (cVar2 != '\0') {
    __s = __s_01 + sVar14;
    sVar14 = strcspn(__s," \t");
    __s_01 = __s + sVar14;
    if (__s[sVar14] != '\0') {
      *__s_01 = '\0';
      __s_01 = __s_01 + 1;
    }
    _Var10 = strstartswith(__s,"SHA256:");
    if ((!_Var10) ||
       (sVar14 = strspn(__s + 7,"0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ+/"),
       sVar14 != 0x2b)) {
      _Var10 = strstartswith(__s,"MD5:");
      __s_00 = __s;
      if (_Var10) {
        __s_00 = __s + 4;
      }
      sVar14 = strlen(__s_00);
      pcVar16 = __s;
      pcVar17 = __s;
      if ((sVar14 == 0x2f) &&
         (sVar14 = strspn(__s_00,"0123456789abcdefABCDEF:"), __s_00[sVar14] == '\0')) {
        lVar18 = 1;
        do {
          if (lVar18 + 3 == 0x34) {
            lVar18 = 2;
            goto LAB_00165f37;
          }
        } while ((__s_00[lVar18 + -1] != ':') &&
                (pcVar1 = __s_00 + lVar18, lVar18 = lVar18 + 3, *pcVar1 != ':'));
      }
      goto LAB_00165f5f;
    }
    uVar4 = *(undefined8 *)__s;
    uVar5 = *(undefined8 *)(__s + 8);
    uVar6 = *(undefined8 *)(__s + 0x10);
    uVar7 = *(undefined8 *)(__s + 0x18);
    uVar8 = *(undefined8 *)(__s + 0x20);
    uVar9 = *(undefined8 *)(__s + 0x28);
    *(undefined2 *)(key + 0x30) = *(undefined2 *)(__s + 0x30);
    *(undefined8 *)(key + 0x20) = uVar8;
    *(undefined8 *)(key + 0x28) = uVar9;
    *(undefined8 *)(key + 0x10) = uVar6;
    *(undefined8 *)(key + 0x18) = uVar7;
    *(undefined8 *)key = uVar4;
    *(undefined8 *)(key + 8) = uVar5;
    key[0x32] = '\0';
  }
  goto LAB_001660a0;
  while (pcVar1 = __s_00 + lVar18, lVar18 = lVar18 + 3, *pcVar1 == ':') {
LAB_00165f37:
    if (lVar18 + 3 == 0x32) {
      pp_Var15 = __ctype_tolower_loc();
      for (lVar18 = 0; lVar18 != 0x2f; lVar18 = lVar18 + 1) {
        key[lVar18] = (char)(*pp_Var15)[__s_00[lVar18]];
      }
      key[0x2f] = '\0';
      goto LAB_001660a0;
    }
  }
LAB_00165f5f:
  do {
    cVar3 = *pcVar17;
    if ((cVar3 != '\n') && (cVar3 != '\r')) {
      if (cVar3 == '\0') break;
      *pcVar16 = cVar3;
      pcVar16 = pcVar16 + 1;
    }
    pcVar17 = pcVar17 + 1;
  } while( true );
  *pcVar16 = '\0';
  sVar14 = strlen(__s);
  if ((((8 < sVar14 && (sVar14 & 3) == 0) &&
       (sVar14 = strspn(__s,"0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ+/="),
       __s[sVar14] == '\0')) && (uVar12 = base64_decode_atom(__s,decoded), 2 < (int)uVar12)) &&
     (iVar13 = base64_decode_atom(__s + 4,decoded + uVar12), 3 < (int)(iVar13 + uVar12))) {
    if ((CONCAT13(decoded[0],CONCAT12(decoded[1],CONCAT11(decoded[2],decoded[3]))) < 0x41) &&
       (bVar11 = decoded[3] + 6, sVar14 = strlen(__s), bVar11 / 3 <= sVar14)) {
      sVar14 = strspn(__s,"0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ+/=");
      memmove(key,__s,sVar14);
      key[sVar14] = '\0';
LAB_001660a0:
      return cVar2 != '\0';
    }
  }
  goto LAB_00165e59;
}

Assistant:

bool validate_manual_hostkey(char *key)
{
    char *p, *q, *r, *s;

    /*
     * Step through the string word by word, looking for a word that's
     * in one of the formats we like.
     */
    p = key;
    while ((p += strspn(p, " \t"))[0]) {
        q = p;
        p += strcspn(p, " \t");
        if (*p) *p++ = '\0';

        /*
         * Now q is our word.
         */

        if (strstartswith(q, "SHA256:")) {
            /* Test for a valid SHA256 key fingerprint. */
            r = q + 7;
            if (strspn(r, BASE64_CHARS_NOEQ) == 43) {
                memmove(key, q, 50); /* 7-char prefix + 43-char base64 */
                key[50] = '\0';
                return true;
            }
        }

        r = q;
        if (strstartswith(r, "MD5:"))
            r += 4;
        if (strlen(r) == 16*3 - 1 &&
            r[strspn(r, "0123456789abcdefABCDEF:")] == 0) {
            /*
             * Test for a valid MD5 key fingerprint. Check the colons
             * are in the right places, and if so, return the same
             * fingerprint canonicalised into lowercase.
             */
            int i;
            for (i = 0; i < 16; i++)
                if (r[3*i] == ':' || r[3*i+1] == ':')
                    goto not_fingerprint; /* sorry */
            for (i = 0; i < 15; i++)
                if (r[3*i+2] != ':')
                    goto not_fingerprint; /* sorry */
            for (i = 0; i < 16*3 - 1; i++)
                key[i] = tolower(r[i]);
            key[16*3 - 1] = '\0';
            return true;
        }
      not_fingerprint:;

        /*
         * Before we check for a public-key blob, trim newlines out of
         * the middle of the word, in case someone's managed to paste
         * in a public-key blob _with_ them.
         */
        for (r = s = q; *r; r++)
            if (*r != '\n' && *r != '\r')
                *s++ = *r;
        *s = '\0';

        if (strlen(q) % 4 == 0 && strlen(q) > 2*4 &&
            q[strspn(q, BASE64_CHARS_ALL)] == 0) {
            /*
             * Might be a base64-encoded SSH-2 public key blob. Check
             * that it starts with a sensible algorithm string. No
             * canonicalisation is necessary for this string type.
             *
             * The algorithm string must be at most 64 characters long
             * (RFC 4251 section 6).
             */
            unsigned char decoded[6];
            unsigned alglen;
            int minlen;
            int len = 0;

            len += base64_decode_atom(q, decoded+len);
            if (len < 3)
                goto not_ssh2_blob;    /* sorry */
            len += base64_decode_atom(q+4, decoded+len);
            if (len < 4)
                goto not_ssh2_blob;    /* sorry */

            alglen = GET_32BIT_MSB_FIRST(decoded);
            if (alglen > 64)
                goto not_ssh2_blob;    /* sorry */

            minlen = ((alglen + 4) + 2) / 3;
            if (strlen(q) < minlen)
                goto not_ssh2_blob;    /* sorry */

            size_t base64_len = strspn(q, BASE64_CHARS_ALL);
            memmove(key, q, base64_len);
            key[base64_len] = '\0';
            return true;
        }
      not_ssh2_blob:;
    }

    return false;
}